

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvbios.c
# Opt level: O3

void printcmd(uint32_t off,uint32_t length)

{
  ulong uVar1;
  int iVar2;
  uint32_t uVar3;
  
  printf("0x%08x:",off);
  uVar3 = 0;
  if (length != 0) {
    uVar1 = 0;
    do {
      printf(" %02x",(ulong)bios->data[off + (int)uVar1]);
      uVar1 = uVar1 + 1;
    } while (length != uVar1);
    uVar3 = length;
    if (0xf < length) {
      return;
    }
  }
  iVar2 = uVar3 - 0x10;
  do {
    printf("   ");
    iVar2 = iVar2 + 1;
  } while (iVar2 != 0);
  return;
}

Assistant:

void printcmd (uint32_t off, uint32_t length) {
	printf ("0x%08x:", off);
	int i;
	for (i = 0; i < length; i++)
		printf(" %02x", bios->data[off+i]);
	for (; i < 16; i++)
		printf ("   ");
}